

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O1

shared_ptr<QPDFLogger> QPDFLogger::defaultLogger(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  shared_ptr<QPDFLogger> sVar3;
  
  if (defaultLogger()::l == '\0') {
    iVar2 = __cxa_guard_acquire(&defaultLogger()::l);
    in_RDX._M_pi = extraout_RDX;
    if (iVar2 != 0) {
      create();
      __cxa_atexit(std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &defaultLogger::l,&__dso_handle);
      __cxa_guard_release(&defaultLogger()::l);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  (in_RDI->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       defaultLogger::l.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = defaultLogger::l.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (in_RDI->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = defaultLogger::l.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  sVar3.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<QPDFLogger>)sVar3.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFLogger>
QPDFLogger::defaultLogger()
{
    static auto l = create();
    return l;
}